

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O3

void __thiscall LinkedList<int>::~LinkedList(LinkedList<int> *this)

{
  Node<int> *pNVar1;
  Node<int> *pNVar2;
  Node<int> *pNVar3;
  int iVar4;
  
  if (0 < this->size) {
    iVar4 = 0;
    pNVar2 = this->head->next;
    pNVar3 = this->head;
    do {
      pNVar1 = pNVar2;
      operator_delete(pNVar3,0x10);
      if (pNVar1 == (Node<int> *)0x0) {
        pNVar2 = (Node<int> *)0x0;
      }
      else {
        pNVar2 = pNVar1->next;
      }
      iVar4 = iVar4 + 1;
      pNVar3 = pNVar1;
    } while (iVar4 < this->size);
  }
  return;
}

Assistant:

LinkedList<T>::~LinkedList()
{
    auto curr = this->head;
    auto currNext = curr->next;

    for(int i = 0; i < size; i++)
    {
        delete curr;
        curr = currNext;
        if(curr != nullptr)
        {
            currNext = curr->next;
        }
    }
}